

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O1

void Cmd::ltrim(string *s)

{
  pointer pcVar1;
  pointer pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  ulong uVar4;
  
  pcVar1 = (s->_M_dataplus)._M_p;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<Cmd::ltrim(std::__cxx11::string&)::_lambda(unsigned_char)_1_>>
                    (pcVar1,pcVar1 + s->_M_string_length);
  pcVar2 = (s->_M_dataplus)._M_p;
  uVar4 = (long)pcVar1 - (long)pcVar2;
  if (pcVar2 + s->_M_string_length != _Var3._M_current) {
    std::__cxx11::string::_M_erase((ulong)s,uVar4);
    return;
  }
  s->_M_string_length = uVar4;
  pcVar2[uVar4] = '\0';
  return;
}

Assistant:

static void ltrim(std::string &s) {
		s.erase(s.begin(), std::find_if(s.begin(), s.end(), [](unsigned char ch) { return !std::isspace(ch); }));
	}